

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O0

string * t_py_generator::get_real_py_module
                   (string *__return_storage_ptr__,t_program *program,bool gen_twisted,
                   string *package_dir)

{
  t_program *this;
  ulong uVar1;
  string *psVar2;
  allocator local_a9;
  string local_a8;
  undefined1 local_88 [8];
  string real_module;
  allocator local_51;
  string local_50;
  byte local_29;
  string *local_28;
  string *package_dir_local;
  t_program *ptStack_18;
  bool gen_twisted_local;
  t_program *program_local;
  string *twisted_module;
  
  local_28 = package_dir;
  package_dir_local._7_1_ = gen_twisted;
  ptStack_18 = program;
  program_local = (t_program *)__return_storage_ptr__;
  if (gen_twisted) {
    local_29 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,"py.twisted",&local_51);
    t_program::get_namespace(__return_storage_ptr__,program,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    uVar1 = std::__cxx11::string::empty();
    real_module.field_2._M_local_buf[8] = (uVar1 & 1) == 0;
    if ((bool)real_module.field_2._M_local_buf[8]) {
      local_29 = 1;
    }
    real_module.field_2._9_3_ = 0;
    if ((local_29 & 1) == 0) {
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
    }
    if (real_module.field_2._8_4_ != 0) {
      return __return_storage_ptr__;
    }
  }
  this = ptStack_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,"py",&local_a9);
  t_program::get_namespace((string *)local_88,this,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::operator+(__return_storage_ptr__,package_dir,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
  }
  else {
    psVar2 = t_program::get_name_abi_cxx11_(ptStack_18);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
  }
  real_module.field_2._8_4_ = 1;
  std::__cxx11::string::~string((string *)local_88);
  return __return_storage_ptr__;
}

Assistant:

static std::string get_real_py_module(const t_program* program, bool gen_twisted, std::string package_dir="") {
    if (gen_twisted) {
      std::string twisted_module = program->get_namespace("py.twisted");
      if (!twisted_module.empty()) {
        return twisted_module;
      }
    }

    std::string real_module = program->get_namespace("py");
    if (real_module.empty()) {
      return program->get_name();
    }
    return package_dir + real_module;
  }